

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O3

int it_asy_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  char *ptr;
  int n;
  long n_00;
  
  if ((sample->flags & 0x10) == 0) {
    iVar1 = sample->length;
  }
  else {
    iVar1 = sample->length;
    n = sample->loop_end;
    if (iVar1 - n != 0 && n <= iVar1) {
      sample->length = n;
      n_00 = (long)(iVar1 - n);
      goto LAB_00712b10;
    }
  }
  n_00 = 0;
  n = iVar1;
LAB_00712b10:
  ptr = (char *)malloc((long)n);
  sample->data = ptr;
  if (ptr != (char *)0x0) {
    if (n != 0) {
      dumbfile_getnc(ptr,n,f);
    }
    dumbfile_skip(f,n_00);
    iVar1 = dumbfile_error(f);
    return iVar1;
  }
  return -1;
}

Assistant:

static int it_asy_read_sample_data( IT_SAMPLE *sample, DUMBFILE *f )
{
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ( ( sample->flags & IT_SAMPLE_LOOP ) && sample->loop_end < sample->length ) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc( sample->length );

	if ( !sample->data )
		return -1;

	if ( sample->length )
		dumbfile_getnc( sample->data, sample->length, f );

	dumbfile_skip( f, truncated_size );

	return dumbfile_error( f );
}